

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TArray<intercept_t,_intercept_t>::Resize(TArray<intercept_t,_intercept_t> *this,uint amount)

{
  uint uVar1;
  uint amount_00;
  
  uVar1 = this->Count;
  amount_00 = amount - uVar1;
  if (amount < uVar1 || amount_00 == 0) {
    if (amount_00 != 0) {
      DoDelete(this,amount,uVar1 - 1);
    }
  }
  else {
    Grow(this,amount_00);
  }
  this->Count = amount;
  return;
}

Assistant:

void Resize (unsigned int amount)
	{
		if (Count < amount)
		{
			// Adding new entries
			Grow (amount - Count);
			for (unsigned int i = Count; i < amount; ++i)
			{
				::new((void *)&Array[i]) T;
			}
		}
		else if (Count != amount)
		{
			// Deleting old entries
			DoDelete (amount, Count - 1);
		}
		Count = amount;
	}